

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O2

bool __thiscall Clasp::Lookahead::propagateFixpoint(Lookahead *this,Solver *s,PostPropagator *ctx)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  ebo local_38;
  
  if (((((this->nodes_).ebo_.buf)->next != 0) && (this->top_ != (s->assign_).trail.ebo_.size)) ||
     (bVar3 = true, (this->score).deps.ebo_.size == 0)) {
    do {
      sVar1 = (s->levels_).super_type.ebo_.size;
      bVar3 = propagateLevel(this,s);
      if (bVar3) goto LAB_00185a96;
      bVar2 = Solver::resolveConflict(s);
    } while ((bVar2) && (bVar2 = Solver::propagateUntil(s,&this->super_PostPropagator), bVar2));
    ScoreLook::clearDeps(&this->score);
LAB_00185a96:
    if ((bVar3 && sVar1 == 0) && ((this->score).limit != 0)) {
      this->top_ = (s->assign_).trail.ebo_.size;
      local_38.buf = (this->imps_).ebo_.buf;
      (this->imps_).ebo_.buf = (pointer)0x0;
      local_38.size = (this->imps_).ebo_.size;
      local_38.cap = (this->imps_).ebo_.cap;
      (this->imps_).ebo_.size = 0;
      (this->imps_).ebo_.cap = 0;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&local_38);
    }
    if (((ctx == (PostPropagator *)0x0) && (this->limit_ != 0)) &&
       (uVar4 = this->limit_ - 1, this->limit_ = uVar4, uVar4 == 0)) {
      (*(this->super_PostPropagator).super_Constraint._vptr_Constraint[5])(this,s,1);
    }
  }
  return bVar3;
}

Assistant:

bool Lookahead::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	if ((empty() || top_ == s.numAssignedVars()) && !score.deps.empty()) {
		// nothing to lookahead
		return true;
	}
	bool ok = true;
	uint32 dl;
	for (dl = s.decisionLevel(); !propagateLevel(s); dl = s.decisionLevel()) {
		// some literal failed
		// resolve and propagate conflict
		assert(s.decisionLevel() >= dl);
		if (!s.resolveConflict() || !s.propagateUntil(this)) {
			ok = false;
			score.clearDeps();
			break;
		}
	}
	if (ok && dl == 0 && score.limit > 0) {
		// remember top-level size - no need to redo lookahead
		// on level 0 unless we learn a new implication
		assert(s.queueSize() == 0);
		top_ = s.numAssignedVars();
		LitVec().swap(imps_);
	}
	if (!ctx && limit_ && --limit_ == 0) {
		this->destroy(&s, true);
	}
	return ok;
}